

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O2

Constant *
spvtools::opt::descsroautil::GetAccessChainIndexAsConst
          (IRContext *context,Instruction *access_chain)

{
  uint32_t uVar1;
  ConstantManager *this;
  Constant *pCVar2;
  
  uVar1 = Instruction::NumInOperands(access_chain);
  if (uVar1 < 2) {
    return (Constant *)0x0;
  }
  uVar1 = GetFirstIndexOfAccessChain(access_chain);
  this = IRContext::get_constant_mgr(context);
  pCVar2 = analysis::ConstantManager::FindDeclaredConstant(this,uVar1);
  return pCVar2;
}

Assistant:

const analysis::Constant* GetAccessChainIndexAsConst(
    IRContext* context, Instruction* access_chain) {
  if (access_chain->NumInOperands() <= 1) {
    return nullptr;
  }
  uint32_t idx_id = GetFirstIndexOfAccessChain(access_chain);
  const analysis::Constant* idx_const =
      context->get_constant_mgr()->FindDeclaredConstant(idx_id);
  return idx_const;
}